

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O0

item * __thiscall NaDynAr<double>::fetch_item(NaDynAr<double> *this,int index)

{
  bool bVar1;
  int in_ESI;
  NaDynAr<double> *in_RDI;
  item *p;
  int i;
  item *local_20;
  int local_18;
  item *local_8;
  
  bVar1 = good(in_RDI,in_ESI);
  if (bVar1) {
    local_20 = in_RDI->pHead;
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      local_20 = local_20->pNext;
    }
    local_8 = local_20;
  }
  else {
    local_8 = (item *)0x0;
  }
  return local_8;
}

Assistant:

item*		fetch_item (int index) const {
    if(!good(index))
      return NULL;

    int	i;
    item	*p = pHead;

    for(i = 0; i < index; ++i)
      p = p->pNext;

    return p;
  }